

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndisr<(moira::Instr)62,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  PrefetchQueue PVar1;
  u16 uVar2;
  uint uVar3;
  u32 uVar4;
  
  if ((this->reg).sr.s != false) {
    PVar1 = this->queue;
    readExt(this);
    uVar2 = getSR(this,&(this->reg).sr);
    (*this->_vptr_Moira[0x19])(this,8);
    uVar3 = (uint)PVar1 ^ (uint)uVar2;
    (this->reg).sr.n = SUB41((uVar3 & 0xffff) >> 0xf,0);
    (this->reg).sr.z = uVar2 == PVar1.irc;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    setSR(this,(u16)uVar3);
    readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    return;
  }
  execPrivilegeException(this);
  return;
}

Assistant:

void
Moira::execAndisr(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    u32 src = readI<S>();
    u16 dst = getSR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setSR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}